

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

adaptive_huffman_data_model * __thiscall
crnlib::adaptive_huffman_data_model::operator=
          (adaptive_huffman_data_model *this,adaptive_huffman_data_model *rhs)

{
  decoder_tables *pdVar1;
  decoder_tables *in_RSI;
  decoder_tables *in_RDI;
  decoder_tables *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    in_RDI->m_num_syms = in_RSI->m_num_syms;
    in_RDI->m_total_used_syms = in_RSI->m_total_used_syms;
    in_RDI->m_table_bits = in_RSI->m_table_bits;
    in_RDI->m_table_shift = in_RSI->m_table_shift;
    vector<unsigned_short>::operator=
              ((vector<unsigned_short> *)in_RSI,(vector<unsigned_short> *)in_RDI);
    vector<unsigned_short>::operator=
              ((vector<unsigned_short> *)in_RSI,(vector<unsigned_short> *)in_RDI);
    vector<unsigned_char>::operator=
              ((vector<unsigned_char> *)in_RSI,(vector<unsigned_char> *)in_RDI);
    if (*(long *)(in_RSI->m_max_codes + 9) == 0) {
      crnlib_delete<crnlib::prefix_coding::decoder_tables>((decoder_tables *)0x230698);
      *(undefined8 *)(in_RDI->m_max_codes + 9) = 0;
    }
    else if (*(long *)(in_RDI->m_max_codes + 9) == 0) {
      pdVar1 = crnlib_new<crnlib::prefix_coding::decoder_tables,crnlib::prefix_coding::decoder_tables>
                         (in_RDI);
      *(decoder_tables **)(in_RDI->m_max_codes + 9) = pdVar1;
    }
    else {
      prefix_coding::decoder_tables::operator=(in_RSI,in_RDI);
    }
    *(char *)(in_RDI->m_max_codes + 0xb) = (char)in_RSI->m_max_codes[0xb];
    *(byte *)((long)in_RDI->m_max_codes + 0x2d) = *(byte *)((long)in_RSI->m_max_codes + 0x2d) & 1;
    local_8 = in_RDI;
  }
  return (adaptive_huffman_data_model *)local_8;
}

Assistant:

adaptive_huffman_data_model& adaptive_huffman_data_model::operator=(const adaptive_huffman_data_model& rhs) {
  if (this == &rhs)
    return *this;

  m_total_syms = rhs.m_total_syms;

  m_update_cycle = rhs.m_update_cycle;
  m_symbols_until_update = rhs.m_symbols_until_update;

  m_total_count = rhs.m_total_count;

  m_sym_freq = rhs.m_sym_freq;

  m_codes = rhs.m_codes;
  m_code_sizes = rhs.m_code_sizes;

  if (rhs.m_pDecode_tables) {
    if (m_pDecode_tables)
      *m_pDecode_tables = *rhs.m_pDecode_tables;
    else
      m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
  } else {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }

  m_decoder_table_bits = rhs.m_decoder_table_bits;
  m_encoding = rhs.m_encoding;

  return *this;
}